

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

void __thiscall
rsg::AssignOp::AssignOp(AssignOp *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  ValueRange *this_00;
  Storage SVar1;
  Type TVar2;
  VariableManager *pVVar3;
  pointer ppVVar4;
  pointer ppVVar5;
  deRandom *pdVar6;
  ValueRangeAccess valueRange_00;
  ValueRangeAccess dst;
  ValueEntryIterator<rsg::IsWritableEntry> first;
  ConstValueRangeAccess other;
  ValueEntryIterator<rsg::IsWritableEntry> last;
  bool bVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  runtime_error *this_01;
  pointer pSVar10;
  long lVar11;
  int ndx;
  int iVar12;
  pointer ppVVar13;
  Scalar *pSVar14;
  pointer pSVar15;
  ValueEntry *val;
  ValueEntry *pVVar16;
  pointer ppVVar17;
  float fVar18;
  ConstValueRangeAccess selectedRange;
  ValueRange local_168;
  pointer local_e8;
  pointer pSStack_e0;
  pointer local_d8;
  ValueEntry *local_d0;
  ValueRange *local_c8;
  Scalar *pSStack_c0;
  Scalar *local_b8;
  ValueRange *local_b0;
  Scalar *pSStack_a8;
  Scalar *local_a0;
  ValueRange *local_98;
  Scalar *pSStack_90;
  Scalar *local_88;
  VariableType local_80;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__AssignOp_00d597d0;
  this_00 = &this->m_valueRange;
  ValueRange::ValueRange(this_00,valueRange);
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_lvalueExpr = (Expression *)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_rvalueExpr = (Expression *)0x0;
  if ((this->m_valueRange).m_type.m_baseType == TYPE_VOID) {
    pVVar3 = state->m_varManager;
    ppVVar17 = (pVVar3->m_entryCache).
               super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    while ((bVar7 = ppVVar17 !=
                    (pVVar3->m_entryCache).
                    super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish, bVar7 &&
           ((SVar1 = (*ppVVar17)->m_variable->m_storage, STORAGE_PARAMETER_INOUT < SVar1 ||
            ((0xe5U >> (SVar1 & 0x1f) & 1) == 0))))) {
      ppVVar17 = ppVVar17 + 1;
    }
    iVar12 = state->m_shaderParams->maxCombinedVariableScalars - pVVar3->m_numAllocatedScalars;
    if ((!bVar7) ||
       ((0 < iVar12 && (fVar18 = deRandom_getFloat(&state->m_random->m_rnd), fVar18 < 0.1)))) {
      computeRandomType(&local_80,state,iVar12);
      ValueRange::ValueRange(&local_168,&local_80);
      VariableType::operator=(&this_00->m_type,&local_168.m_type);
      std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
                (&(this->m_valueRange).m_min,&local_168.m_min);
      std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
                (&(this->m_valueRange).m_max,&local_168.m_max);
      ValueRange::~ValueRange(&local_168);
      VariableType::~VariableType(&local_80);
      pSStack_90 = (this->m_valueRange).m_min.
                   super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                   super__Vector_impl_data._M_start;
      local_88 = (this->m_valueRange).m_max.
                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (pSStack_90 ==
          (this->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pSStack_90 = (Scalar *)0x0;
      }
      if (local_88 ==
          (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_88 = (Scalar *)0x0;
      }
      valueRange_00.super_ConstValueRangeAccess.m_min = pSStack_90;
      valueRange_00.super_ConstValueRangeAccess.m_type = &this_00->m_type;
      valueRange_00.super_ConstValueRangeAccess.m_max = local_88;
      local_98 = this_00;
      computeRandomValueRange(state,valueRange_00);
    }
    else {
      local_80._0_8_ =
           (state->m_varManager->m_entryCache).
           super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_168.m_type._0_8_ =
           (state->m_varManager->m_entryCache).
           super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      while ((local_80._0_8_ != local_168.m_type._0_8_ &&
             ((7 < *(uint *)(**(long **)local_80._0_8_ + 0x50) ||
              ((0xe5U >> (*(uint *)(**(long **)local_80._0_8_ + 0x50) & 0x1f) & 1) == 0))))) {
        local_80._0_8_ = local_80._0_8_ + 8;
      }
      local_d0 = (ValueEntry *)0x0;
      first.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      .m_end._M_current = (ValueEntry **)local_168.m_type._0_8_;
      first.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      .m_iter._M_current = (ValueEntry **)local_80._0_8_;
      first.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      ._16_8_ = local_80.m_typeName._M_string_length;
      last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      .m_end._M_current = (ValueEntry **)local_168.m_type._0_8_;
      last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      .m_iter._M_current = (ValueEntry **)local_168.m_type._0_8_;
      last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      ._16_8_ = local_168.m_type.m_typeName._M_string_length;
      local_168.m_type.m_typeName._M_dataplus._M_p = (pointer)local_168.m_type._0_8_;
      local_80.m_typeName._M_dataplus._M_p = (pointer)local_168.m_type._0_8_;
      de::Random::choose<rsg::ValueEntryIterator<rsg::IsWritableEntry>,rsg::ValueEntry_const**>
                (state->m_random,first,last,&local_d0,1);
      pSStack_a8 = (local_d0->m_valueRange).m_min.
                   super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                   super__Vector_impl_data._M_start;
      local_a0 = (local_d0->m_valueRange).m_max.
                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (pSStack_a8 ==
          (local_d0->m_valueRange).m_min.
          super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSStack_a8 = (Scalar *)0x0;
      }
      if (local_a0 ==
          (local_d0->m_valueRange).m_max.
          super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_a0 = (Scalar *)0x0;
      }
      local_b0 = &local_d0->m_valueRange;
      other.m_min = pSStack_a8;
      other.m_type = &local_b0->m_type;
      other.m_max = local_a0;
      ValueRange::ValueRange(&local_168,other);
      VariableType::operator=(&this_00->m_type,&local_168.m_type);
      std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
                (&(this->m_valueRange).m_min,&local_168.m_min);
      std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
                (&(this->m_valueRange).m_max,&local_168.m_max);
      ValueRange::~ValueRange(&local_168);
      pSVar15 = (this->m_valueRange).m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pSVar15 ==
          (this->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pSVar15 = (pointer)0x0;
      }
      pSVar10 = (this->m_valueRange).m_max.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pSVar10 ==
          (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pSVar10 = (pointer)0x0;
      }
      TVar2 = (this->m_valueRange).m_type.m_baseType;
      if (TVar2 != TYPE_BOOL) {
        pdVar6 = &state->m_random->m_rnd;
        if (TVar2 == TYPE_INT) {
          if (0 < (this->m_valueRange).m_type.m_numElements) {
            lVar11 = 0;
            do {
              VariableType::getElementType(&this_00->m_type);
              lVar11 = lVar11 + 1;
            } while (lVar11 < (this->m_valueRange).m_type.m_numElements);
          }
        }
        else {
          if (TVar2 != TYPE_FLOAT) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_168.m_type._0_8_ = &local_168.m_type.m_typeName._M_string_length;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_168,
                       "computeRandomValueRangeForInfElements(): unsupported type","");
            std::runtime_error::runtime_error(this_01,(string *)&local_168);
            *(undefined ***)this_01 = &PTR__runtime_error_00d59498;
            __cxa_throw(this_01,&Exception::typeinfo,std::runtime_error::~runtime_error);
          }
          if (0 < (this->m_valueRange).m_type.m_numElements) {
            lVar11 = 0;
            do {
              VariableType::getElementType(&this_00->m_type);
              if ((pSVar15[lVar11].intVal == -0x800000) &&
                 (VariableType::getElementType(&this_00->m_type),
                 pSVar10[lVar11].intVal == 0x7f800000)) {
                dVar8 = deRandom_getUint32(pdVar6);
                dVar9 = deRandom_getUint32(pdVar6);
                fVar18 = (float)(int)(dVar9 % (0x141 - dVar8 % 0x141)) * 0.1 + -16.0;
                VariableType::getElementType(&this_00->m_type);
                pSVar15[lVar11].floatVal = fVar18;
                VariableType::getElementType(&this_00->m_type);
                pSVar10[lVar11].floatVal = (float)(dVar8 % 0x141) * 0.1 + fVar18;
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < (this->m_valueRange).m_type.m_numElements);
          }
        }
      }
    }
  }
  pVVar3 = state->m_varManager;
  local_168.m_type.m_typeName._M_dataplus._M_p =
       (pointer)(this->m_valueRange).m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_168.m_type.m_typeName._M_string_length =
       (size_type)
       (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
       _M_impl.super__Vector_impl_data._M_start;
  if ((pointer)local_168.m_type.m_typeName._M_dataplus._M_p ==
      (this->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_168.m_type.m_typeName._M_dataplus._M_p = (pointer)(pointer)0x0;
  }
  if ((pointer)local_168.m_type.m_typeName._M_string_length ==
      (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_168.m_type.m_typeName._M_string_length = (size_type)(pointer)0x0;
  }
  ppVVar17 = (pVVar3->m_entryCache).
             super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_168.m_type._0_8_ = this_00;
  if (ppVVar17 !=
      (pVVar3->m_entryCache).
      super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      bVar7 = anon_unknown_0::IsWritableIntersectingEntry::operator()
                        ((IsWritableIntersectingEntry *)&local_168,*ppVVar17);
      if (bVar7) break;
      ppVVar17 = ppVVar17 + 1;
    } while (ppVVar17 !=
             (pVVar3->m_entryCache).
             super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  ppVVar4 = (pVVar3->m_entryCache).
            super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_d8 = (pointer)local_168.m_type.m_typeName._M_string_length;
  local_e8 = (pointer)local_168.m_type._0_8_;
  pSStack_e0 = (pointer)local_168.m_type.m_typeName._M_dataplus._M_p;
  ppVVar5 = (state->m_varManager->m_entryCache).
            super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar7 = anon_unknown_0::canAllocateVariable(state,&this_00->m_type);
  if ((!bVar7) ||
     ((ppVVar17 != ppVVar5 && (fVar18 = deRandom_getFloat(&state->m_random->m_rnd), 0.5 <= fVar18)))
     ) {
    if (ppVVar17 != ppVVar5) {
      pSVar15 = (pointer)0x0;
      ppVVar13 = ppVVar17;
      do {
        pVVar16 = *ppVVar13;
        local_168.m_type.m_typeName._M_dataplus._M_p =
             (pointer)(pVVar16->m_valueRange).m_min.
                      super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_168.m_type.m_typeName._M_string_length =
             (size_type)
             (pVVar16->m_valueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
        if ((pointer)local_168.m_type.m_typeName._M_dataplus._M_p ==
            (pVVar16->m_valueRange).m_min.
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_168.m_type.m_typeName._M_dataplus._M_p = (pointer)pSVar15;
        }
        local_168.m_type._0_8_ = &pVVar16->m_valueRange;
        if ((pointer)local_168.m_type.m_typeName._M_string_length ==
            (pVVar16->m_valueRange).m_max.
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_168.m_type.m_typeName._M_string_length = (size_type)pSVar15;
        }
        local_80.m_typeName._M_dataplus._M_p =
             (pointer)(this->m_valueRange).m_min.
                      super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_80.m_typeName._M_string_length =
             (size_type)
             (this->m_valueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
        if ((pointer)local_80.m_typeName._M_dataplus._M_p ==
            (this->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_80.m_typeName._M_dataplus._M_p = (pointer)pSVar15;
        }
        if ((pointer)local_80.m_typeName._M_string_length ==
            (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_80.m_typeName._M_string_length = (size_type)pSVar15;
        }
        local_80._0_8_ = this_00;
        bVar7 = ConstValueRangeAccess::isSupersetOf
                          ((ConstValueRangeAccess *)&local_168,(ConstValueRangeAccess *)&local_80);
        if (bVar7) {
          return;
        }
        local_168.m_type.m_typeName._M_string_length = (size_type)local_d8;
        local_168.m_type._0_8_ = local_e8;
        local_168.m_type.m_typeName._M_dataplus._M_p = (pointer)pSStack_e0;
        do {
          ppVVar13 = ppVVar13 + 1;
          if (ppVVar13 == ppVVar4) break;
          bVar7 = anon_unknown_0::IsWritableIntersectingEntry::operator()
                            ((IsWritableIntersectingEntry *)&local_168,*ppVVar13);
        } while (!bVar7);
      } while (ppVVar13 != ppVVar5);
    }
    pdVar6 = &state->m_random->m_rnd;
    pVVar16 = (ValueEntry *)0x0;
    iVar12 = 0;
    do {
      if ((iVar12 < 1) || (dVar8 = deRandom_getUint32(pdVar6), (int)(dVar8 % (iVar12 + 1U)) < 1)) {
        pVVar16 = *ppVVar17;
      }
      local_168.m_type.m_typeName._M_string_length = (size_type)local_d8;
      local_168.m_type._0_8_ = local_e8;
      local_168.m_type.m_typeName._M_dataplus._M_p = (pointer)pSStack_e0;
      do {
        ppVVar17 = ppVVar17 + 1;
        if (ppVVar17 == ppVVar4) break;
        bVar7 = anon_unknown_0::IsWritableIntersectingEntry::operator()
                          ((IsWritableIntersectingEntry *)&local_168,*ppVVar17);
      } while (!bVar7);
      iVar12 = iVar12 + 1;
    } while (ppVVar17 != ppVVar5);
    local_80._0_8_ = &pVVar16->m_valueRange;
    local_80.m_typeName._M_dataplus._M_p =
         (pointer)(pVVar16->m_valueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_80.m_typeName._M_string_length =
         (size_type)
         (pVVar16->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pSVar14 = (Scalar *)0x0;
    if ((Scalar *)local_80.m_typeName._M_dataplus._M_p ==
        (pVVar16->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_80.m_typeName._M_dataplus._M_p = (pointer)pSVar14;
    }
    if ((Scalar *)local_80.m_typeName._M_string_length ==
        (pVVar16->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_80.m_typeName._M_string_length = (size_type)pSVar14;
    }
    local_168.m_type.m_typeName._M_dataplus._M_p =
         (pointer)(this->m_valueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_168.m_type.m_typeName._M_string_length =
         (size_type)
         (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
         _M_impl.super__Vector_impl_data._M_start;
    if ((Scalar *)local_168.m_type.m_typeName._M_dataplus._M_p ==
        (this->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_168.m_type.m_typeName._M_dataplus._M_p = (pointer)pSVar14;
    }
    if ((Scalar *)local_168.m_type.m_typeName._M_string_length ==
        (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_168.m_type.m_typeName._M_string_length = (size_type)pSVar14;
    }
    dst.super_ConstValueRangeAccess.m_min = (Scalar *)local_168.m_type.m_typeName._M_dataplus._M_p;
    dst.super_ConstValueRangeAccess.m_type = &this_00->m_type;
    dst.super_ConstValueRangeAccess.m_max = (Scalar *)local_168.m_type.m_typeName._M_string_length;
    local_168.m_type._0_8_ = this_00;
    local_c8 = this_00;
    pSStack_c0 = (Scalar *)local_168.m_type.m_typeName._M_dataplus._M_p;
    local_b8 = (Scalar *)local_168.m_type.m_typeName._M_string_length;
    ValueRange::computeIntersection
              (dst,(ConstValueRangeAccess *)&local_168,(ConstValueRangeAccess *)&local_80);
  }
  return;
}

Assistant:

AssignOp::AssignOp (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_valueRange	(valueRange)
	, m_lvalueExpr	(DE_NULL)
	, m_rvalueExpr	(DE_NULL)
{
	if (m_valueRange.getType().isVoid())
	{
		// Compute random value range
		int		maxScalars		= state.getShaderParameters().maxCombinedVariableScalars - state.getVariableManager().getNumAllocatedScalars();
		bool	useRandomRange	= !state.getVariableManager().hasEntry<IsWritableEntry>() || ((maxScalars > 0) && getWeightedBool(state.getRandom(), 0.1f));

		if (useRandomRange)
		{
			DE_ASSERT(maxScalars > 0);
			m_valueRange = ValueRange(computeRandomType(state, maxScalars));
			computeRandomValueRange(state, m_valueRange.asAccess());
		}
		else
		{
			// Use value range from random entry
			// \todo [2011-02-28 pyry] Give lower weight to entries without range? Choose subtype range?
			const ValueEntry* entry = state.getRandom().choose<const ValueEntry*>(state.getVariableManager().getBegin<IsWritableEntry>(), state.getVariableManager().getEnd<IsWritableEntry>());
			m_valueRange = ValueRange(entry->getValueRange());

			computeRandomValueRangeForInfElements(state, m_valueRange.asAccess());

			DE_ASSERT(state.getVariableManager().hasEntry(IsWritableIntersectingEntry(m_valueRange.asAccess())));
		}
	}

	IsWritableIntersectingEntry::Iterator first	= state.getVariableManager().getBegin(IsWritableIntersectingEntry(m_valueRange.asAccess()));
	IsWritableIntersectingEntry::Iterator end	= state.getVariableManager().getEnd(IsWritableIntersectingEntry(m_valueRange.asAccess()));

	bool possiblyCreateVar = canAllocateVariable(state, m_valueRange.getType()) &&
							 (first == end || getWeightedBool(state.getRandom(), 0.5f));

	if (!possiblyCreateVar)
	{
		// Find all possible valueranges matching given type and intersecting with valuerange
		// \todo [pyry] Actually collect all ValueRanges, currently operates only on whole variables
		DE_ASSERT(first != end);

		// Try to select one closest to given range but bigger (eg. superset)
		bool supersetExists = false;
		for (IsWritableIntersectingEntry::Iterator i = first; i != end; i++)
		{
			if ((*i)->getValueRange().isSupersetOf(m_valueRange.asAccess()))
			{
				supersetExists = true;
				break;
			}
		}

		if (!supersetExists)
		{
			// Select some other range and compute intersection
			// \todo [2011-02-03 pyry] Use some heuristics to select the range?
			ConstValueRangeAccess selectedRange = state.getRandom().choose<const ValueEntry*>(first, end)->getValueRange();

			ValueRange::computeIntersection(m_valueRange.asAccess(), m_valueRange.asAccess(), selectedRange);
		}
	}
}